

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O1

int Abc_NtkMfsSolveSatResub
              (Mfs_Man_t *p,Abc_Obj_t *pNode,int iFanin,int fOnlyRemove,int fSkipUpdate)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pNode_00;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  void **ppvVar9;
  ulong uVar10;
  Hop_Obj_t *pHVar11;
  abctime aVar12;
  void *pvVar13;
  abctime aVar14;
  uint uVar15;
  int iVar16;
  undefined4 in_register_00000014;
  undefined8 uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int local_a4;
  timespec ts;
  int pCands [12];
  
  uVar17 = CONCAT44(in_register_00000014,iFanin);
  if (iFanin < 0) {
    __assert_fail("iFanin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsResub.c"
                  ,0xae,"int Abc_NtkMfsSolveSatResub(Mfs_Man_t *, Abc_Obj_t *, int, int, int)");
  }
  p->nTryRemoves = p->nTryRemoves + 1;
  pVVar4 = p->vDivCexes;
  if (0 < pVVar4->nSize) {
    iVar16 = p->nDivWords;
    lVar21 = 0;
    do {
      memset(pVVar4->pArray[lVar21],0xff,(long)iVar16 << 2);
      lVar21 = lVar21 + 1;
    } while (lVar21 < pVVar4->nSize);
  }
  p->nCexes = 0;
  if (p->pPars->fVeryVerbose != 0) {
    uVar8 = pNode->Id;
    uVar15 = *(uint *)&pNode->field_0x14;
    uVar19 = p->vSupp->nSize;
    uVar1 = p->vNodes->nSize;
    iVar16 = p->vDivs->nSize;
    uVar2 = (pNode->vFanins).nSize;
    lVar21 = (long)(pNode->vFanins).pArray[(uint)iFanin];
    pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[lVar21];
    uVar20 = 0;
    if ((pNode_00->vFanouts).nSize == 1) {
      uVar6 = Abc_NodeMffcLabel(pNode_00,(Vec_Ptr_t *)0x0);
      uVar20 = (ulong)uVar6;
    }
    printf("%5d : Lev =%3d. Leaf =%3d. Node =%3d. Divs =%3d.  Fanin = %4d (%d/%d), MFFC = %d\n",
           (ulong)uVar8,(ulong)(uVar15 >> 0xc),(ulong)uVar19,(ulong)uVar1,(ulong)(iVar16 - uVar2),
           lVar21,uVar17,(ulong)uVar2,uVar20);
  }
  p->vMfsFanins->nSize = 0;
  local_a4 = 0;
  iVar16 = 0;
  if (0 < (pNode->vFanins).nSize) {
    uVar20 = 0;
    iVar16 = 0;
    do {
      if ((uint)iFanin != uVar20) {
        pvVar13 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar20]];
        pVVar4 = p->vMfsFanins;
        uVar8 = pVVar4->nCap;
        if (pVVar4->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = ppvVar9;
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar8 * 2;
            if (iVar7 <= (int)uVar8) goto LAB_004c3808;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar8 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar8 << 4);
            }
            pVVar4->pArray = ppvVar9;
          }
          pVVar4->nCap = iVar7;
        }
LAB_004c3808:
        iVar7 = pVVar4->nSize;
        pVVar4->nSize = iVar7 + 1;
        pVVar4->pArray[iVar7] = pvVar13;
        uVar10 = (uint)(p->vDivs->nSize - (pNode->vFanins).nSize) + uVar20;
        iVar7 = (int)uVar10;
        if ((iVar7 < 0) || (p->vProjVarsSat->nSize <= iVar7)) goto LAB_004c3bff;
        lVar21 = (long)iVar16;
        iVar16 = iVar16 + 1;
        pCands[lVar21] = p->vProjVarsSat->pArray[uVar10 & 0xffffffff] * 2 + 1;
      }
      uVar20 = uVar20 + 1;
    } while ((long)uVar20 < (long)(pNode->vFanins).nSize);
  }
  iVar7 = Abc_NtkMfsTryResubOnce(p,pCands,iVar16);
  if (iVar7 != -1) {
    if (iVar7 == 1) {
      if (p->pPars->fVeryVerbose != 0) {
        printf("Node %d: Fanin %d can be removed.\n",(ulong)(uint)pNode->Id,uVar17);
      }
      p->nNodesResub = p->nNodesResub + 1;
      p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
      if (fSkipUpdate == 0) {
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar21 = 1;
        }
        else {
          lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar21 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        pHVar11 = Abc_NtkMfsInterplate(p,pCands,iVar16);
        if (pHVar11 == (Hop_Obj_t *)0x0) {
          return 0;
        }
        Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar11);
        iVar16 = clock_gettime(3,(timespec *)&ts);
        if (iVar16 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        p->timeInt = p->timeInt + lVar18 + lVar21;
        p->nRemoves = p->nRemoves + 1;
      }
LAB_004c3b39:
      local_a4 = 1;
    }
    else if ((fOnlyRemove == 0) && (p->pPars->fRrOnly == 0)) {
      p->nTryResubs = p->nTryResubs + 1;
LAB_004c3944:
      uVar8 = ((p->nCexes >> 5) + 1) - (uint)((p->nCexes & 0x1fU) == 0);
      if (p->nDivWords < (int)uVar8) {
        __assert_fail("nWords <= p->nDivWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsResub.c"
                      ,0x100,"int Abc_NtkMfsSolveSatResub(Mfs_Man_t *, Abc_Obj_t *, int, int, int)")
        ;
      }
      iVar7 = p->vDivs->nSize;
      iVar3 = (pNode->vFanins).nSize;
      uVar19 = 0;
      uVar15 = iVar7 - iVar3;
      if (uVar15 != 0 && iVar3 <= iVar7) {
        uVar20 = 0;
        do {
          if (p->pPars->fPower == 0) goto LAB_004c39ce;
          if ((long)iVar7 <= (long)uVar20) goto LAB_004c3c1e;
          pVVar5 = p->vProbs;
          if (pVVar5 == (Vec_Int_t *)0x0) {
LAB_004c39ce:
            if ((long)p->vDivCexes->nSize <= (long)uVar20) {
LAB_004c3c1e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if ((int)uVar8 < 1) {
              uVar10 = 0;
            }
            else {
              uVar10 = 0;
              do {
                if (*(int *)((long)p->vDivCexes->pArray[uVar20] + uVar10 * 4) != -1)
                goto LAB_004c3a05;
                uVar10 = uVar10 + 1;
              } while (uVar8 != uVar10);
              uVar10 = (ulong)uVar8;
            }
LAB_004c3a05:
            if ((uint)uVar10 == uVar8) goto LAB_004c3a18;
          }
          else {
            uVar19 = *(uint *)((long)p->vDivs->pArray[uVar20] + 0x10);
            if (pVVar5->nSize <= (int)uVar19) goto LAB_004c39ce;
            if ((int)uVar19 < 0) goto LAB_004c3bff;
            if ((float)pVVar5->pArray[uVar19] < 0.15) goto LAB_004c39ce;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar15);
        uVar20 = (ulong)uVar15;
LAB_004c3a18:
        uVar19 = (uint)uVar20;
      }
      if (uVar19 != uVar15) goto code_r0x004c3a23;
      local_a4 = 0;
    }
  }
  return local_a4;
code_r0x004c3a23:
  if (p->vProjVarsSat->nSize <= (int)uVar19) {
LAB_004c3bff:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pCands[iVar16] = p->vProjVarsSat->pArray[uVar19] * 2 + 1;
  iVar7 = Abc_NtkMfsTryResubOnce(p,pCands,iVar16 + 1);
  if (iVar7 == -1) {
    return 0;
  }
  if (iVar7 == 1) {
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %d: Fanin %d can be replaced by divisor %d.\n",(ulong)(uint)pNode->Id,uVar17,
             (ulong)uVar19);
    }
    p->nNodesResub = p->nNodesResub + 1;
    p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
    if (fSkipUpdate == 0) {
      aVar12 = Abc_Clock();
      pHVar11 = Abc_NtkMfsInterplate(p,pCands,iVar16 + 1);
      if (pHVar11 == (Hop_Obj_t *)0x0) {
        return 0;
      }
      pVVar4 = p->vMfsFanins;
      pvVar13 = Vec_PtrEntry(p->vDivs,uVar19);
      Vec_PtrPush(pVVar4,pvVar13);
      Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar11);
      aVar14 = Abc_Clock();
      p->timeInt = p->timeInt + (aVar14 - aVar12);
      p->nResubs = p->nResubs + 1;
    }
    goto LAB_004c3b39;
  }
  if (p->pPars->nWinMax <= p->nCexes) {
    if (p->pPars->fVeryVerbose == 0) {
      return 0;
    }
    printf("Node %d: Cannot find replacement for fanin %d.\n",(ulong)(uint)pNode->Id,uVar17);
    return 0;
  }
  goto LAB_004c3944;
}

Assistant:

int Abc_NtkMfsSolveSatResub( Mfs_Man_t * p, Abc_Obj_t * pNode, int iFanin, int fOnlyRemove, int fSkipUpdate )
{
    int fVeryVerbose = 0;//p->pPars->fVeryVerbose && Vec_PtrSize(p->vDivs) < 200;// || pNode->Id == 556;
    unsigned * pData;
    int pCands[MFS_FANIN_MAX];
    int RetValue, iVar, i, nCands, nWords, w;
    abctime clk;
    Abc_Obj_t * pFanin;
    Hop_Obj_t * pFunc;
    assert( iFanin >= 0 );
    p->nTryRemoves++;

    // clean simulation info
    Vec_PtrFillSimInfo( p->vDivCexes, 0, p->nDivWords ); 
    p->nCexes = 0;
    if ( p->pPars->fVeryVerbose )
    {
//        printf( "\n" );
        printf( "%5d : Lev =%3d. Leaf =%3d. Node =%3d. Divs =%3d.  Fanin = %4d (%d/%d), MFFC = %d\n", 
            pNode->Id, pNode->Level, Vec_PtrSize(p->vSupp), Vec_PtrSize(p->vNodes), Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode), 
            Abc_ObjFaninId(pNode, iFanin), iFanin, Abc_ObjFaninNum(pNode), 
            Abc_ObjFanoutNum(Abc_ObjFanin(pNode, iFanin)) == 1 ? Abc_NodeMffcLabel(Abc_ObjFanin(pNode, iFanin), NULL) : 0 );
    }

    // try fanins without the critical fanin
    nCands = 0;
    Vec_PtrClear( p->vMfsFanins );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( i == iFanin )
            continue;
        Vec_PtrPush( p->vMfsFanins, pFanin );
        iVar = Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode) + i;
        pCands[nCands++] = toLitCond( Vec_IntEntry( p->vProjVarsSat, iVar ), 1 );
    }
    RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands );
    if ( RetValue == -1 )
        return 0;
    if ( RetValue == 1 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Node %d: Fanin %d can be removed.\n", pNode->Id, iFanin );
        p->nNodesResub++;
        p->nNodesGainedLevel++;
        if ( fSkipUpdate )
            return 1;
clk = Abc_Clock();
        // derive the function
        pFunc = Abc_NtkMfsInterplate( p, pCands, nCands );
        if ( pFunc == NULL )
            return 0;
        // update the network
        Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
        p->nRemoves++;
        return 1;
    }

    if ( fOnlyRemove || p->pPars->fRrOnly )
        return 0;

    p->nTryResubs++;
    if ( fVeryVerbose )
    {
        for ( i = 0; i < 9; i++ )
            printf( " " );
        for ( i = 0; i < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); i++ )
            printf( "%d", i % 10 );
        for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
            if ( i == iFanin )
                printf( "*" );
            else
                printf( "%c", 'a' + i );
        printf( "\n" );
    }
    iVar = -1;
    while ( 1 ) 
    {
        if ( fVeryVerbose )
        {
            printf( "%3d: %3d ", p->nCexes, iVar );
            for ( i = 0; i < Vec_PtrSize(p->vDivs); i++ )
            {
                pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
                printf( "%d", Abc_InfoHasBit(pData, p->nCexes-1) );
            }
            printf( "\n" );
        }

        // find the next divisor to try
        nWords = Abc_BitWordNum(p->nCexes);
        assert( nWords <= p->nDivWords );
        for ( iVar = 0; iVar < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); iVar++ )
        {
            if ( p->pPars->fPower )
            {
                Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar);
                // only accept the divisor if it is "cool"
                if ( Abc_MfsObjProb(p, pDiv) >= 0.15 )
                    continue;
            }
            pData  = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar );
            for ( w = 0; w < nWords; w++ )
                if ( pData[w] != ~0 )
                    break;
            if ( w == nWords )
                break;
        }
        if ( iVar == Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode) )
            return 0;

        pCands[nCands] = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar), 1 );
        RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands+1 );
        if ( RetValue == -1 )
            return 0;
        if ( RetValue == 1 )
        {
            if ( p->pPars->fVeryVerbose )
                printf( "Node %d: Fanin %d can be replaced by divisor %d.\n", pNode->Id, iFanin, iVar );
            p->nNodesResub++;
            p->nNodesGainedLevel++;
            if ( fSkipUpdate )
                return 1;
clk = Abc_Clock();
            // derive the function
            pFunc = Abc_NtkMfsInterplate( p, pCands, nCands+1 );
            if ( pFunc == NULL )
                return 0;
            // update the network
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar) );
            Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
            p->nResubs++;
            return 1;
        }
        if ( p->nCexes >= p->pPars->nWinMax )
            break;
    }
    if ( p->pPars->fVeryVerbose )
        printf( "Node %d: Cannot find replacement for fanin %d.\n", pNode->Id, iFanin );
    return 0;
}